

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

back_insert_iterator<std::vector<int,_std::allocator<int>_>_>
get_simplex_vertices<std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
          (index_t idx,index_t dim,index_t v,binomial_coeff_table *binomial_coeff,
          back_insert_iterator<std::vector<int,_std::allocator<int>_>_> out)

{
  int iVar1;
  int iVar2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> __value;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_R8;
  index_t k;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> local_10 [2];
  
  iVar1 = in_EDX + -1;
  local_10[0].container = in_R8;
  for (iVar2 = in_ESI + 1; 0 < iVar2; iVar2 = iVar2 + -1) {
    get_next_vertex((index_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                    (index_t)((ulong)in_RCX >> 0x20),(index_t)in_RCX,
                    (binomial_coeff_table *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    __value = std::back_insert_iterator<std::vector<int,_std::allocator<int>_>_>::operator++
                        (local_10,0);
    std::back_insert_iterator<std::vector<int,_std::allocator<int>_>_>::operator*
              ((back_insert_iterator<std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffc8);
    std::back_insert_iterator<std::vector<int,_std::allocator<int>_>_>::operator=
              ((back_insert_iterator<std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(value_type_conflict2 *)__value.container);
    binomial_coeff_table::operator()
              ((binomial_coeff_table *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               (index_t)((ulong)__value.container >> 0x20),(index_t)__value.container);
  }
  return (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)local_10[0].container;
}

Assistant:

OutputIterator get_simplex_vertices(index_t idx, const index_t dim, index_t v,
                                    const binomial_coeff_table& binomial_coeff, OutputIterator out) {
	--v;
	for (index_t k = dim + 1; k > 0; --k) {
		get_next_vertex(v, idx, k, binomial_coeff);
		*out++ = v;
		idx -= binomial_coeff(v, k);
	}
	return out;
}